

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.c
# Opt level: O2

int build_regex_nfa(LexState *ls,uint8 **areg,NFAState *pp,NFAState *nn,Action *trailing)

{
  byte *pbVar1;
  long lVar2;
  uint *v;
  Action **ppAVar3;
  anon_struct_40_4_d8687ec6_for_accepts *v_00;
  byte bVar4;
  int iVar5;
  uint uVar6;
  Action **ppAVar7;
  NFAState **ppNVar8;
  long lVar9;
  uint8 **ppuVar10;
  int iVar11;
  ushort **ppuVar12;
  NFAState *pNVar13;
  byte *pbVar14;
  ulong uVar15;
  __int32_t **pp_Var16;
  byte bVar17;
  uint uVar18;
  ulong uVar19;
  NFAState **ppNVar20;
  long lVar21;
  NFAState *pNVar22;
  anon_struct_40_4_d8687ec6_for_epsilon *paVar23;
  anon_struct_40_4_d8687ec6 *v_01;
  long lVar24;
  uint8 *puVar25;
  byte *local_168;
  uint8 **local_160;
  Action *local_158;
  anon_struct_40_4_d8687ec6_for_epsilon *local_150;
  NFAState **local_148;
  NFAState *local_140;
  uint8 mark [256];
  
  local_150 = &pp->epsilon;
  local_148 = (pp->epsilon).e;
  uVar18 = 0;
  local_168 = *areg;
  pNVar13 = pp;
  local_160 = areg;
  local_158 = trailing;
  local_140 = pp;
LAB_0013d270:
  pNVar22 = pNVar13;
  ppuVar10 = local_160;
  pbVar14 = local_168 + 1;
  bVar4 = *local_168;
  uVar15 = (ulong)bVar4;
  pNVar13 = pNVar22;
  switch(bVar4) {
  case 0x28:
    local_168 = pbVar14;
    pNVar13 = new_NFAState(ls);
    iVar11 = build_regex_nfa(ls,&local_168,pNVar22,pNVar13,trailing);
    uVar18 = (uint)(iVar11 != 0 || uVar18 != 0);
    pp = pNVar22;
    goto LAB_0013d270;
  case 0x29:
    goto switchD_0013d2c5_caseD_29;
  case 0x2a:
    goto switchD_0013d2c5_caseD_2a;
  case 0x2b:
    goto switchD_0013d2c5_caseD_2b;
  case 0x2c:
  case 0x2d:
  case 0x2e:
switchD_0013d2c5_caseD_2c:
    local_168 = pbVar14;
    if ((ls->ignore_case == 0) ||
       (ppuVar12 = __ctype_b_loc(), (*(byte *)((long)*ppuVar12 + uVar15 * 2 + 1) & 4) == 0)) {
      v_01 = pNVar22->chars + uVar15;
      ppNVar8 = pNVar22->chars[uVar15].v;
      if (ppNVar8 == (NFAState **)0x0) {
        pNVar13 = new_NFAState(ls);
        pNVar22->chars[uVar15].v = pNVar22->chars[uVar15].e;
        uVar6 = v_01->n;
        v_01->n = uVar6 + 1;
        pNVar22->chars[uVar15].e[uVar6] = pNVar13;
        pp = pNVar22;
      }
      else {
        if (ppNVar8 == pNVar22->chars[uVar15].e) {
          if (2 < v_01->n) goto LAB_0013d6fe;
        }
        else if ((v_01->n & 7) == 0) {
LAB_0013d6fe:
          pNVar13 = new_NFAState(ls);
          goto LAB_0013d9a8;
        }
        pNVar13 = new_NFAState(ls);
        ppNVar8 = pNVar22->chars[uVar15].v;
        uVar6 = v_01->n;
        v_01->n = uVar6 + 1;
        ppNVar8[uVar6] = pNVar13;
        pp = pNVar22;
      }
      goto LAB_0013d270;
    }
    pp_Var16 = __ctype_tolower_loc();
    iVar11 = (*pp_Var16)[uVar15];
    ppNVar8 = pNVar22->chars[iVar11].v;
    if (ppNVar8 == (NFAState **)0x0) {
      pNVar13 = new_NFAState(ls);
      uVar19 = (ulong)(uint)((int)uVar15 * 4);
      iVar11 = *(int *)((long)*pp_Var16 + uVar19);
      pNVar22->chars[iVar11].v = pNVar22->chars[iVar11].e;
      iVar5 = *(int *)((long)*pp_Var16 + uVar19);
      uVar6 = pNVar22->chars[iVar5].n;
      pNVar22->chars[iVar5].n = uVar6 + 1;
      pNVar22->chars[iVar11].e[uVar6] = pNVar13;
    }
    else {
      uVar6 = pNVar22->chars[iVar11].n;
      if (ppNVar8 == pNVar22->chars[iVar11].e) {
        if (uVar6 < 3) goto LAB_0013d555;
      }
      else if ((uVar6 & 7) != 0) {
LAB_0013d555:
        pNVar13 = new_NFAState(ls);
        iVar11 = (*pp_Var16)[uVar15];
        ppNVar8 = pNVar22->chars[iVar11].v;
        uVar6 = pNVar22->chars[iVar11].n;
        pNVar22->chars[iVar11].n = uVar6 + 1;
        ppNVar8[uVar6] = pNVar13;
        goto LAB_0013d92a;
      }
      pNVar13 = new_NFAState(ls);
      vec_add_internal(pNVar22->chars + iVar11,pNVar13);
    }
LAB_0013d92a:
    pp_Var16 = __ctype_toupper_loc();
    iVar11 = (*pp_Var16)[uVar15];
    v_01 = pNVar22->chars + iVar11;
    ppNVar20 = pNVar22->chars[iVar11].e;
    ppNVar8 = pNVar22->chars[iVar11].v;
    trailing = local_158;
    if (ppNVar8 != (NFAState **)0x0) {
      uVar6 = v_01->n;
      if (ppNVar8 == ppNVar20) {
        if (uVar6 < 3) goto LAB_0013d99d;
      }
      else if ((uVar6 & 7) != 0) {
LAB_0013d99d:
        v_01->n = uVar6 + 1;
        ppNVar8[uVar6] = pNVar13;
        pp = pNVar22;
        goto LAB_0013d270;
      }
LAB_0013d9a8:
      vec_add_internal(v_01,pNVar13);
      pp = pNVar22;
      goto LAB_0013d270;
    }
    v_01->v = ppNVar20;
    uVar6 = pNVar22->chars[(*pp_Var16)[uVar15]].n;
    pNVar22->chars[(*pp_Var16)[uVar15]].n = uVar6 + 1;
    v_01->e[uVar6] = pNVar13;
    pp = pNVar22;
    goto LAB_0013d270;
  case 0x2f:
    ppAVar7 = (pNVar22->accepts).v;
    ppAVar3 = (pNVar22->accepts).e;
    if (ppAVar7 == (Action **)0x0) {
      (pNVar22->accepts).v = ppAVar3;
      uVar18 = (pNVar22->accepts).n;
      (pNVar22->accepts).n = uVar18 + 1;
      (pNVar22->accepts).e[uVar18] = trailing;
      local_168 = pbVar14;
    }
    else {
      v_00 = &pNVar22->accepts;
      uVar18 = v_00->n;
      if (ppAVar7 == ppAVar3) {
        if (2 < uVar18) goto LAB_0013d727;
      }
      else if ((uVar18 & 7) == 0) {
LAB_0013d727:
        local_168 = pbVar14;
        vec_add_internal(v_00,trailing);
        goto LAB_0013d72f;
      }
      v_00->n = uVar18 + 1;
      ppAVar7[uVar18] = trailing;
      local_168 = pbVar14;
    }
LAB_0013d72f:
    uVar18 = 1;
    goto LAB_0013d270;
  default:
    if (bVar4 != 0x3f) {
      if (bVar4 == 0x5b) {
        bVar4 = *pbVar14;
        if (bVar4 == 0x5e) {
          pbVar14 = local_168 + 2;
        }
        local_168 = pbVar14;
        memset(mark,0,0x100);
        uVar15 = 0xff;
        do {
          while (bVar17 = *pbVar14, bVar17 == 0x2d) {
            bVar17 = pbVar14[1];
            if (bVar17 == 0x5c) {
              bVar17 = pbVar14[2];
              pbVar14 = pbVar14 + 3;
            }
            else {
              if (bVar17 == 0) goto LAB_0013d9bd;
              pbVar14 = pbVar14 + 2;
            }
            if (bVar17 == 0) goto LAB_0013d9bd;
            for (; (byte)uVar15 <= bVar17; uVar15 = (ulong)(byte)((byte)uVar15 + 1)) {
              mark[uVar15] = '\x01';
            }
          }
          if (bVar17 == 0x5c) {
            bVar17 = pbVar14[1];
            pbVar14 = pbVar14 + 2;
          }
          else {
            pbVar14 = pbVar14 + 1;
            if ((bVar17 == 0) || (bVar17 == 0x5d)) goto LAB_0013d5ae;
          }
          uVar15 = (ulong)bVar17;
          mark[uVar15] = '\x01';
        } while( true );
      }
      if (bVar4 == 0x5c) {
        pbVar14 = local_168 + 2;
        pbVar1 = local_168 + 1;
        uVar15 = (ulong)*pbVar1;
        local_168 = pbVar14;
        if (*pbVar1 == 0) {
LAB_0013d9bd:
          d_fail("bad (part of) regex: %s\n",*local_160);
          return uVar18;
        }
        goto switchD_0013d2c5_caseD_2c;
      }
      if (bVar4 == 0x7c) {
        ppNVar20 = (pNVar22->epsilon).v;
        ppNVar8 = (pNVar22->epsilon).e;
        if (ppNVar20 == (NFAState **)0x0) {
          (pNVar22->epsilon).v = ppNVar8;
          uVar6 = (pNVar22->epsilon).n;
          (pNVar22->epsilon).n = uVar6 + 1;
          (pNVar22->epsilon).e[uVar6] = nn;
          local_168 = pbVar14;
        }
        else {
          paVar23 = &pNVar22->epsilon;
          uVar6 = paVar23->n;
          if (ppNVar20 == ppNVar8) {
            if (2 < uVar6) goto LAB_0013d82b;
          }
          else if ((uVar6 & 7) == 0) {
LAB_0013d82b:
            local_168 = pbVar14;
            vec_add_internal(paVar23,nn);
            goto LAB_0013d838;
          }
          paVar23->n = uVar6 + 1;
          ppNVar20[uVar6] = nn;
          local_168 = pbVar14;
        }
LAB_0013d838:
        pNVar22 = local_140;
        ppNVar8 = (local_140->epsilon).v;
        if (ppNVar8 == (NFAState **)0x0) {
          pNVar13 = new_NFAState(ls);
          (pNVar22->epsilon).v = local_148;
          uVar6 = (pNVar22->epsilon).n;
          (pNVar22->epsilon).n = uVar6 + 1;
          (pNVar22->epsilon).e[uVar6] = pNVar13;
          goto LAB_0013d270;
        }
        if (ppNVar8 == local_148) {
          if (2 < local_150->n) goto LAB_0013d8c5;
        }
        else if ((local_150->n & 7) == 0) {
LAB_0013d8c5:
          pNVar13 = new_NFAState(ls);
          vec_add_internal(local_150,pNVar13);
          goto LAB_0013d270;
        }
        pNVar13 = new_NFAState(ls);
        uVar6 = (pNVar22->epsilon).n;
        (pNVar22->epsilon).n = uVar6 + 1;
        (pNVar22->epsilon).v[uVar6] = pNVar13;
        goto LAB_0013d270;
      }
      if (bVar4 == 0) goto switchD_0013d2c5_caseD_29;
      goto switchD_0013d2c5_caseD_2c;
    }
    ppNVar20 = (pp->epsilon).v;
    ppNVar8 = (pp->epsilon).e;
    if (ppNVar20 == (NFAState **)0x0) {
      (pp->epsilon).v = ppNVar8;
      uVar6 = (pp->epsilon).n;
      (pp->epsilon).n = uVar6 + 1;
      (pp->epsilon).e[uVar6] = pNVar22;
      local_168 = pbVar14;
      goto LAB_0013d270;
    }
    paVar23 = &pp->epsilon;
    uVar6 = paVar23->n;
    if (ppNVar20 == ppNVar8) {
      local_168 = pbVar14;
      if (2 < uVar6) goto LAB_0013d8f8;
LAB_0013d8ed:
      paVar23->n = uVar6 + 1;
      ppNVar20[uVar6] = pNVar22;
      local_168 = pbVar14;
      goto LAB_0013d270;
    }
    local_168 = pbVar14;
    if ((uVar6 & 7) != 0) goto LAB_0013d8ed;
    goto LAB_0013d8f8;
  }
LAB_0013d5ae:
  local_168 = pbVar14;
  pNVar13 = new_NFAState(ls);
  puVar25 = mark;
  lVar24 = 0x30;
  for (lVar21 = 0x40; puVar25 = puVar25 + 1, pp = pNVar22, trailing = local_158, lVar21 != 0x2818;
      lVar21 = lVar21 + 0x28) {
    if ((*puVar25 == '\0') == (bVar4 == 0x5e)) {
      lVar9 = *(long *)((long)pNVar22->chars[0].e + lVar24 + -0x10);
      lVar2 = (long)pNVar22->chars[0].e + lVar21 + -0x18;
      if (lVar9 == 0) {
        *(long *)((long)pNVar22->chars[0].e + lVar24 + -0x10) = lVar2;
        uVar6 = *(uint *)((long)pNVar22->chars[0].e + lVar24 + -0x18);
        *(uint *)((long)pNVar22->chars[0].e + lVar24 + -0x18) = uVar6 + 1;
        *(NFAState **)((long)pNVar22->chars[0].e + lVar21 + (ulong)uVar6 * 8 + -0x18) = pNVar13;
      }
      else {
        v = (uint *)((long)pNVar22->chars[0].e + lVar24 + -0x18);
        uVar6 = *v;
        if (lVar2 == lVar9) {
          if (2 < uVar6) goto LAB_0013d639;
        }
        else if ((uVar6 & 7) == 0) {
LAB_0013d639:
          vec_add_internal(v,pNVar13);
          goto LAB_0013d641;
        }
        *v = uVar6 + 1;
        *(NFAState **)(lVar9 + (ulong)uVar6 * 8) = pNVar13;
      }
    }
LAB_0013d641:
    lVar24 = lVar24 + 0x28;
  }
  goto LAB_0013d270;
switchD_0013d2c5_caseD_2a:
  ppNVar20 = (pp->epsilon).v;
  ppNVar8 = (pp->epsilon).e;
  if (ppNVar20 == (NFAState **)0x0) {
    (pp->epsilon).v = ppNVar8;
    uVar6 = (pp->epsilon).n;
    (pp->epsilon).n = uVar6 + 1;
    (pp->epsilon).e[uVar6] = pNVar22;
  }
  else {
    paVar23 = &pp->epsilon;
    uVar6 = paVar23->n;
    if (ppNVar20 == ppNVar8) {
      if (2 < uVar6) goto LAB_0013d748;
    }
    else if ((uVar6 & 7) == 0) {
LAB_0013d748:
      local_168 = pbVar14;
      vec_add_internal(paVar23,pNVar22);
      pbVar14 = local_168;
      goto switchD_0013d2c5_caseD_2b;
    }
    paVar23->n = uVar6 + 1;
    ppNVar20[uVar6] = pNVar22;
  }
switchD_0013d2c5_caseD_2b:
  local_168 = pbVar14;
  ppNVar20 = (pNVar22->epsilon).v;
  ppNVar8 = (pNVar22->epsilon).e;
  if (ppNVar20 == (NFAState **)0x0) {
    (pNVar22->epsilon).v = ppNVar8;
    uVar6 = (pNVar22->epsilon).n;
    (pNVar22->epsilon).n = uVar6 + 1;
    (pNVar22->epsilon).e[uVar6] = pp;
    goto LAB_0013d270;
  }
  paVar23 = &pNVar22->epsilon;
  uVar6 = paVar23->n;
  pNVar22 = pp;
  if (ppNVar20 == ppNVar8) {
    if (2 < uVar6) goto LAB_0013d8f8;
  }
  else if ((uVar6 & 7) == 0) {
LAB_0013d8f8:
    vec_add_internal(paVar23,pNVar22);
    goto LAB_0013d270;
  }
  paVar23->n = uVar6 + 1;
  ppNVar20[uVar6] = pp;
  goto LAB_0013d270;
switchD_0013d2c5_caseD_29:
  ppNVar20 = (pNVar22->epsilon).v;
  ppNVar8 = (pNVar22->epsilon).e;
  if (ppNVar20 == (NFAState **)0x0) {
    (pNVar22->epsilon).v = ppNVar8;
    uVar6 = (pNVar22->epsilon).n;
    (pNVar22->epsilon).n = uVar6 + 1;
    (pNVar22->epsilon).e[uVar6] = nn;
    goto LAB_0013da79;
  }
  paVar23 = &pNVar22->epsilon;
  uVar6 = paVar23->n;
  if (ppNVar20 == ppNVar8) {
    if (2 < uVar6) goto LAB_0013da6c;
  }
  else if ((uVar6 & 7) == 0) {
LAB_0013da6c:
    local_168 = pbVar14;
    vec_add_internal(paVar23,nn);
    goto LAB_0013da79;
  }
  paVar23->n = uVar6 + 1;
  ppNVar20[uVar6] = nn;
LAB_0013da79:
  *ppuVar10 = pbVar14;
  return uVar18;
}

Assistant:

static int build_regex_nfa(LexState *ls, uint8 **areg, NFAState *pp, NFAState *nn, Action *trailing) {
  uint8 c, pc, *reg = *areg;
  NFAState *p = pp, *s, *x, *n = nn;
  int reversed, i, has_trailing = 0;
  uint8 mark[256];

  s = p;
  while ((c = *reg++)) {
    switch (c) {
      case '(':
        has_trailing = build_regex_nfa(ls, &reg, s, (x = new_NFAState(ls)), trailing) || has_trailing;
        p = s;
        s = x;
        break;
      case ')':
        goto Lreturn;
      case '|':
        vec_add(&s->epsilon, nn);
        vec_add(&pp->epsilon, (s = new_NFAState(ls)));
        break;
      case '[':
        if (*reg == '^') {
          reg++;
          reversed = 1;
        } else
          reversed = 0;
        memset(mark, 0, sizeof(mark));
        pc = UCHAR_MAX;
        while ((c = *reg++)) {
          switch (c) {
            case ']':
              goto Lsetdone;
            case '-':
              c = *reg++;
              if (!c) goto Lerror;
              if (c == '\\') c = *reg++;
              if (!c) goto Lerror;
              for (; pc <= c; pc++) mark[pc] = 1;
              break;
            case '\\':
              c = *reg++;
              /* fall through */
            default:
              pc = c;
              mark[c] = 1;
              break;
          }
        }
      Lsetdone:
        x = new_NFAState(ls);
        for (i = 1; i < 256; i++)
          if ((!reversed && mark[i]) || (reversed && !mark[i])) vec_add(&s->chars[i], x);
        p = s;
        s = x;
        break;
      case '?':
        vec_add(&p->epsilon, s);
        break;
      case '*':
        vec_add(&p->epsilon, s);
        vec_add(&s->epsilon, p);
        break;
      case '+':
        vec_add(&s->epsilon, p);
        break;
      case '/':
        vec_add(&s->accepts, trailing);
        has_trailing = 1;
        break;
      case '\\':
        c = *reg++;
        if (!c) goto Lerror;
        /* fall through */
      default:
        if (!ls->ignore_case || !isalpha(c))
          vec_add(&s->chars[c], (x = new_NFAState(ls)));
        else {
          vec_add(&s->chars[tolower(c)], (x = new_NFAState(ls)));
          vec_add(&s->chars[toupper(c)], x);
        }
        p = s;
        s = x;
        break;
    }
  }
Lreturn:
  vec_add(&s->epsilon, n);
  *areg = reg;
  return has_trailing;
Lerror:
  d_fail("bad (part of) regex: %s\n", *areg);
  return has_trailing;
}